

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_vigorize(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int *piVar2;
  CHAR_DATA *in_RDX;
  int in_ESI;
  undefined4 in_R8D;
  int refresh;
  CHAR_DATA *vch;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  CHAR_DATA *in_stack_ffffffffffffffd8;
  CHAR_DATA *bch;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (in_RDX->in_room->sector_type == 8) {
    send_to_char((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  }
  else {
    if ((in_RDX->in_room->area->temp == 0) || (in_RDX->in_room->area->temp == 3)) {
      in_ESI = in_ESI / 2;
    }
    act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,
        (void *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),
        (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
    act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,
        (void *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),
        (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
    for (bch = in_RDX->in_room->people; bch != (CHAR_DATA *)0x0; bch = bch->next_in_room) {
      bVar1 = is_same_group(in_RDX,bch);
      if (!bVar1) {
        is_same_cabal(in_RDX,bch);
      }
      send_to_char((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),bch);
      piVar2 = std::min<int>((int *)&stack0xffffffffffffffd0,(int *)&stack0xffffffffffffffcc);
      bch->move = (short)*piVar2;
    }
  }
  return;
}

Assistant:

void spell_vigorize(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *vch;
	int refresh = 0;

	if (ch->in_room->sector_type == SECT_UNDERWATER)
	{
		send_to_char("You cannot cast this spell underwater.\n\r", ch);
		return;
	}

	refresh = level;

	if (ch->in_room->area->temp == Temperature::Hot || ch->in_room->area->temp == Temperature::Cold)
		refresh /= 2;

	act("You blanket the area with a soothing mist.", ch, 0, 0, TO_CHAR);
	act("$n blankets the area with a soothing mist.", ch, 0, 0, TO_ROOM);

	for (vch = ch->in_room->people; vch; vch = vch->next_in_room)
	{
		if (!(is_same_group(ch, vch) || is_same_cabal(ch, vch)))
			refresh /= 3;

		send_to_char("As the mist settles over you, you feel refreshed!\n\r", vch);
		vch->move = std::min(vch->move + refresh, (int)vch->max_move);
	}
}